

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,wchar_t *src,
          int32_t ins_chars,int undo)

{
  int32_t idx_00;
  long lVar1;
  int32_t ins_chars_local;
  int32_t del_chars_local;
  int32_t idx_local;
  
  ins_chars_local = ins_chars;
  del_chars_local = del_chars;
  idx_local = idx;
  adjust_args(this,&idx_local,&del_chars_local,&ins_chars_local);
  idx_00 = idx_local;
  lVar1 = (long)idx_local;
  if (undo != 0) {
    add_undo_rec(this,self,STRBUF_UNDO_REPL,idx_local,del_chars_local,ins_chars_local);
  }
  splice_move(this,idx_00,del_chars_local,ins_chars_local);
  memcpy((this->super_CVmObject).ext_ + lVar1 * 4 + 0xc,src,(long)ins_chars_local << 2);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const wchar_t *src, int32_t ins_chars,
                                     int undo)
{
    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* delete the old characters and open a gap for the new characters */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* copy in the characters */
    memcpy(get_ext()->buf + idx, src, ins_chars * sizeof(get_ext()->buf[0]));
}